

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11wm.cpp
# Opt level: O3

void __thiscall rw::X11WM::move_resize_window(X11WM *this,Window *window,int x,int y,uint w,uint h)

{
  int iVar1;
  ostream *poVar2;
  XEvent event;
  undefined4 local_c0 [2];
  undefined8 local_b8;
  undefined4 local_b0;
  long local_a0;
  Atom local_98;
  undefined4 local_90;
  undefined8 local_88;
  long local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  
  local_c0[0] = 0x21;
  local_b8 = 0;
  local_b0 = 1;
  local_98 = this->_NET_MOVERESIZE_WINDOW;
  local_a0 = (long)window->window_id;
  local_90 = 0x20;
  local_88 = 0x2f00;
  local_80 = (long)x;
  local_78 = (long)y;
  local_70 = (ulong)w;
  local_68 = (ulong)h;
  iVar1 = XSendEvent(this->display,this->root_window,0,0x180000,local_c0);
  if (iVar1 != 0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "Could not send event to move and resize the window.");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

void X11WM::move_resize_window(const Window * window, int x, int y, unsigned int w, unsigned int h) {
        XEvent event;
        long mask = SubstructureRedirectMask | SubstructureNotifyMask;

        unsigned long gravity_flags = 0;
        // All x, y, w and h are set
        gravity_flags |= (1 << 8);
        gravity_flags |= (1 << 9);
        gravity_flags |= (1 << 10);
        gravity_flags |= (1 << 11);
        gravity_flags |= (1 << 13);

        event.xclient.type = ClientMessage;
        event.xclient.serial = 0;
        event.xclient.send_event = True;
        event.xclient.message_type = _NET_MOVERESIZE_WINDOW;
        event.xclient.window = window->window_id;
        event.xclient.format = 32;
        event.xclient.data.l[0] = (unsigned long) gravity_flags;
        event.xclient.data.l[1] = (unsigned long) x;
        event.xclient.data.l[2] = (unsigned long) y;
        event.xclient.data.l[3] = (unsigned long) w;
        event.xclient.data.l[4] = (unsigned long) h;

        if (!XSendEvent(display, root_window, False, mask, &event)) {
            cerr << "Could not send event to move and resize the window." << endl;
            exit(2);
        }
    }